

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<henson::PythonPuppet>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/puppet.cpp:58:30)>
::do_call(Proxy_Function_Callable_Impl<std::shared_ptr<henson::PythonPuppet>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap_*),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_puppet_cpp:58:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  element_type *in_RDI;
  Boxed_Value BVar1;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_stack_00000020;
  anon_class_40_2_0b0a90de_for_m_f *in_stack_00000028;
  
  BVar1 = dispatch::detail::Do_Call<std::shared_ptr<henson::PythonPuppet>>::
          go<std::shared_ptr<henson::PythonPuppet>(std::__cxx11::string,henson::ProcMap*),chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::__3>
                    (in_stack_00000028,in_stack_00000020,(Type_Conversions_State *)this);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }